

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1242:42)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1242:42)>
          *this,ExceptionOrValue *output)

{
  undefined8 extraout_RAX;
  ExceptionOr<kj::_::Void> depResult;
  NullableValue<kj::Exception> local_348;
  char local_1b0;
  ExceptionOr<kj::_::Void> local_1a8;
  
  local_348.isSet = false;
  local_1b0 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_348);
  if (local_348.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1a8,&local_348.field_1.value);
    local_1a8.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1a8);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1a8);
  }
  else if (local_1b0 == '\x01') {
    anon_class_1_0_00000001_for_func::operator()((anon_class_1_0_00000001_for_func *)this);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1a8);
    NullableValue<kj::Exception>::~NullableValue(&local_348);
    _Unwind_Resume(extraout_RAX);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_348);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }